

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O2

void __thiscall sznet::net::TcpClient::disconnect(TcpClient *this)

{
  TcpConnection *this_00;
  MutexLockGuard local_18;
  MutexLockGuard lock;
  
  this->m_connect = false;
  local_18.m_mutex = &this->m_mutex;
  MutexLock::lock(local_18.m_mutex);
  this_00 = (this->m_connection).
            super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (TcpConnection *)0x0) {
    TcpConnection::forceClose(this_00);
  }
  MutexLockGuard::~MutexLockGuard(&local_18);
  return;
}

Assistant:

void TcpClient::disconnect()
{
	m_connect = false;

	{
		MutexLockGuard lock(m_mutex);
		if (m_connection)
		{
			// m_connection->shutdown();
			m_connection->forceClose();
		}
	}
}